

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFmap.c
# Opt level: O0

void fill_info(NF_link_map *l)

{
  Elf64_Dyn **info;
  Elf64_Dyn *dyn;
  NF_link_map *l_local;
  
  for (info = (Elf64_Dyn **)l->l_ld; *info != (Elf64_Dyn *)0x0; info = info + 2) {
    if (*info < (Elf64_Dyn *)0x23) {
      l->l_info[(long)*info] = (Elf64_Dyn *)info;
    }
    else if (*info == (Elf64_Dyn *)0x6ffffff9) {
      l->l_info[0x22] = (Elf64_Dyn *)info;
    }
    else if (*info == (Elf64_Dyn *)0x6ffffef5) {
      l->l_info[0x23] = (Elf64_Dyn *)info;
    }
  }
  if (l->l_info[6] != (Elf64_Dyn *)0x0) {
    (l->l_info[6]->d_un).d_val = l->l_addr + (l->l_info[6]->d_un).d_val;
  }
  if (l->l_info[5] != (Elf64_Dyn *)0x0) {
    (l->l_info[5]->d_un).d_val = l->l_addr + (l->l_info[5]->d_un).d_val;
  }
  if (l->l_info[7] != (Elf64_Dyn *)0x0) {
    (l->l_info[7]->d_un).d_val = l->l_addr + (l->l_info[7]->d_un).d_val;
  }
  if (l->l_info[0x17] != (Elf64_Dyn *)0x0) {
    (l->l_info[0x17]->d_un).d_val = l->l_addr + (l->l_info[0x17]->d_un).d_val;
  }
  if (l->l_info[0x23] != (Elf64_Dyn *)0x0) {
    (l->l_info[0x23]->d_un).d_val = l->l_addr + (l->l_info[0x23]->d_un).d_val;
  }
  return;
}

Assistant:

static void fill_info(struct NF_link_map *l)
{
    /* this function fill the l_info member of the link map
     * Also, it is implemented under the logic of trying not to include unnecessary info, like link_map itself
     * 
     * In one line, it parse the raw info in l_ld into l_info, which is indexed
     * All the DT_* entries signify the dynamic entry type
     */
    Elf64_Dyn *dyn = l->l_ld;
    Elf64_Dyn **info = l->l_info;

    while (dyn->d_tag != DT_NULL)
    {
        if ((Elf64_Xword)dyn->d_tag < DT_NUM)
            info[dyn->d_tag] = dyn;
        else if ((Elf64_Xword)dyn->d_tag == DT_RELACOUNT)
            //info[ DT_NUM + (DT_VERNEEDNUM - dyn->d_tag)] = dyn; //this is a quick fix for relacount
            info[34] = dyn;
        else if ((Elf64_Xword)dyn->d_tag == DT_GNU_HASH)
            info[35] = dyn;
        //upd: Use fixed index instead of lots of unreadable macros
        ++dyn;
        /* OS specific flags are currently omitted */
    }
/* at this time, the link map is loaded. So dynamic sections using ptr should be rebased here */
#define rebase(tag)                             \
    do                                          \
    {                                           \
        if (info[tag])                          \
            info[tag]->d_un.d_ptr += l->l_addr; \
    } while (0)
    rebase(DT_SYMTAB);
    rebase(DT_STRTAB);
    rebase(DT_RELA);
    rebase(DT_JMPREL);
    rebase(35); //DT_GNU_HASH
}